

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_creator.cpp
# Opt level: O3

Graph * createGridGraph(Graph *__return_storage_ptr__,int n,int cost_min,int cost_max)

{
  StoredVertexList *this;
  long lVar1;
  pointer psVar2;
  long *plVar3;
  long *plVar4;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  *paVar5;
  int max;
  uint uVar6;
  int iVar7;
  int iVar8;
  value_type vVar9;
  __normal_iterator<const_boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>
  _Var10;
  ulong uVar11;
  type *ptVar12;
  size_type __new_size;
  ulong uVar13;
  pointer psVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  Graph *g;
  Graph G;
  EdgeIterator ei;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairlist;
  EdgeIterator ei_end;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_1e0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined1 uStack_198;
  undefined7 uStack_197;
  byte bStack_190;
  long *local_188;
  value_type local_180;
  long *local_178;
  value_type local_170;
  long local_168;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_160;
  ulong local_d0;
  ulong local_c8;
  int local_c0;
  int local_bc;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_b8;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Stack_b0;
  long local_a8;
  long local_98;
  long local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined1 uStack_68;
  undefined8 uStack_67;
  long *local_58;
  
  local_c0 = cost_min;
  local_bc = cost_max;
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_1e0,(no_property *)&local_160);
  uStack_198 = 0;
  uStack_197 = 0;
  bStack_190 = 0;
  local_1a8 = 0;
  local_1a0 = 0;
  uStack_19f = 0;
  uStack_68 = 0;
  uStack_67 = 0;
  local_78 = 0;
  local_70 = 0;
  uStack_6f = 0;
  uVar6 = n * n;
  if (1 < uVar6) {
    uVar15 = n / 2;
    local_c8 = (ulong)uVar15;
    local_d0 = (ulong)(int)(uVar15 * n);
    local_90 = -(ulong)(((uVar6 >> 1) + uVar15) - 1);
    local_98 = -(ulong)((uVar6 >> 1) + uVar15);
    __new_size = 2;
    lVar18 = 0;
    do {
      uVar13 = __new_size - 2;
      iVar7 = (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) %
                   (long)n);
      if (iVar7 != n + -1) {
        if (iVar7 < (int)local_c8 && (long)local_d0 <= (long)uVar13) {
          if ((local_90 + __new_size == 2) || (local_98 + __new_size == 2)) goto LAB_0010ccb3;
          iVar7 = randomRange(0,1);
          uVar17 = __new_size - 1;
          uVar11 = (long)local_1e0.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1e0.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (iVar7 == 0) {
            if (uVar11 <= uVar17) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(&local_1e0.super_type.m_vertices,__new_size);
            }
            psVar14 = local_1e0.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_160.first.vBegin.m_value = uVar13;
            local_160.first.vCurr.m_value = (value_type)operator_new(4);
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                        *)((long)&psVar14[1].super_StoredVertex.m_out_edges.
                                  super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar18),
                       (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
          }
          else {
            if (uVar11 <= uVar17) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(&local_1e0.super_type.m_vertices,__new_size);
            }
            psVar14 = local_1e0.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_160.first.vBegin.m_value = uVar17;
            local_160.first.vCurr.m_value = (value_type)operator_new(4);
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                        *)((long)&(psVar14->super_StoredVertex).m_out_edges.
                                  super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar18),
                       (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
          }
        }
        else {
          if ((ulong)((long)local_1e0.super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e0.super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= __new_size - 1) {
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::resize(&local_1e0.super_type.m_vertices,__new_size);
          }
          psVar14 = local_1e0.super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_160.first.vBegin.m_value = __new_size - 1;
          local_160.first.vCurr.m_value = (value_type)operator_new(4);
          std::
          vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
          ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                    ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                      *)((long)&(psVar14->super_StoredVertex).m_out_edges.
                                super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar18),
                     (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
        }
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
      }
LAB_0010ccb3:
      lVar18 = lVar18 + 0x20;
      lVar1 = __new_size - (uVar6 - 1);
      __new_size = __new_size + 1;
    } while (lVar1 != 1);
  }
  if (uVar6 - n != 0 && n <= (int)uVar6) {
    uVar15 = n / 2;
    local_c8 = (ulong)uVar15;
    local_d0 = (ulong)(~uVar15 + (uVar6 >> 1));
    uVar13 = 0;
    do {
      if (((long)uVar13 < (long)(int)((uVar15 - 1) * n)) ||
         ((int)local_c8 <=
          (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) % (long)n))
         ) {
        uVar17 = uVar13 + (long)n;
        uVar11 = uVar17;
        if (uVar17 < uVar13) {
          uVar11 = uVar13;
        }
        if ((ulong)((long)local_1e0.super_type.m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1e0.super_type.m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(&local_1e0.super_type.m_vertices,uVar11 + 1);
        }
        psVar14 = local_1e0.super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar17;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                    *)(psVar14 + uVar13),
                   (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
LAB_0010ce73:
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
      }
      else if (uVar13 != local_d0) {
        iVar7 = randomRange(0,1);
        uVar17 = uVar13 + (long)n;
        uVar11 = (long)local_1e0.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1e0.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (iVar7 == 0) {
          uVar16 = uVar13;
          if (uVar13 < uVar17) {
            uVar16 = uVar17;
          }
          if (uVar11 <= uVar16) {
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::resize(&local_1e0.super_type.m_vertices,uVar16 + 1);
          }
          psVar14 = local_1e0.super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_160.first.vBegin.m_value = uVar13;
          local_160.first.vCurr.m_value = (value_type)operator_new(4);
          std::
          vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
          ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                    ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                      *)(psVar14 + uVar17),
                     (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
        }
        else {
          uVar16 = uVar17;
          if (uVar17 < uVar13) {
            uVar16 = uVar13;
          }
          if (uVar11 <= uVar16) {
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::resize(&local_1e0.super_type.m_vertices,uVar16 + 1);
          }
          psVar14 = local_1e0.super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_160.first.vBegin.m_value = uVar17;
          local_160.first.vCurr.m_value = (value_type)operator_new(4);
          std::
          vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
          ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                    ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                      *)(psVar14 + uVar13),
                     (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
        }
        goto LAB_0010ce73;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6 - n);
  }
  local_160.first.vEnd.m_value =
       (long)local_1e0.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_1e0.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_b8._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  _Stack_b0._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_a8 = 0;
  if (local_1e0.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_1e0.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    vVar9 = 0;
  }
  else {
    ptVar12 = (type *)&((local_1e0.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_StoredVertex).m_out_edges
                       .
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    local_160.first.vCurr.m_value = 0;
    do {
      if (*ptVar12 != (type)((_Vector_impl_data *)(ptVar12 + -1))->_M_start) {
        local_160.first.edges.super_type.m_initialized = true;
        local_160.first.edges.super_type.m_storage.dummy_.aligner_ =
             (type)((_Vector_impl_data *)(ptVar12 + -1))->_M_start;
        local_160.first.edges.super_type.m_storage.dummy_._8_8_ = local_160.first.vCurr.m_value;
        local_160.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar12;
        local_160.first.edges.super_type.m_storage.dummy_._24_8_ = local_160.first.vCurr.m_value;
        goto LAB_0010cfb5;
      }
      local_160.first.vCurr.m_value = local_160.first.vCurr.m_value + 1;
      ptVar12 = ptVar12 + 4;
      vVar9 = local_160.first.vEnd.m_value;
    } while (local_160.first.vEnd.m_value != local_160.first.vCurr.m_value);
  }
  local_160.first.edges.super_type.m_initialized = false;
  local_160.first.vCurr.m_value = vVar9;
LAB_0010cfb5:
  local_160.first.vBegin.m_value = 0;
  local_160.first.m_g = &local_1e0;
  local_160.second.vBegin.m_value = 0;
  local_160.second.edges.super_type.m_initialized = false;
  local_160.second.vCurr.m_value = local_160.first.vEnd.m_value;
  local_160.second.vEnd.m_value = local_160.first.vEnd.m_value;
  local_160.second.m_g = local_160.first.m_g;
  local_88 = &local_1a8;
  local_80 = &local_78;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_88,&local_160);
LAB_0010d015:
  do {
    if (CONCAT71(uStack_19f,local_1a0) == CONCAT71(uStack_6f,local_70)) {
      if (CONCAT71(uStack_19f,local_1a0) != CONCAT71(uStack_197,uStack_198)) {
        if ((bStack_190 == 0) || (uStack_67._7_1_ == '\0')) goto LAB_0010d5aa;
        if (local_188 != local_58) goto LAB_0010d064;
      }
      boost::
      adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
      ::
      adjacency_list<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>>
                ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                  *)__return_storage_ptr__,local_b8,_Stack_b0,
                 (long)local_1e0.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1e0.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,0,(no_property *)&local_160);
      psVar14 = (__return_storage_ptr__->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (__return_storage_ptr__->super_type).m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_160.first.vEnd.m_value = (long)psVar2 - (long)psVar14 >> 5;
      if (psVar2 != psVar14) {
        ptVar12 = (type *)&(psVar14->super_StoredVertex).m_out_edges.
                           super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
        local_160.first.vCurr.m_value = 0;
        break;
      }
      vVar9 = 0;
      goto LAB_0010d1af;
    }
LAB_0010d064:
    if ((bStack_190 & 1) == 0) goto LAB_0010d5aa;
    local_160.first.vBegin.m_value = local_180;
    local_88 = (undefined8 *)*local_188;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long,unsigned_long>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&local_b8,(unsigned_long *)&local_160,(unsigned_long *)&local_88);
    if (bStack_190 == 0) {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_188 = local_188 + 2;
    if (local_188 == local_178) {
      vVar9 = CONCAT71(uStack_19f,local_1a0);
      lVar18 = vVar9 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_197,uStack_198) - 1U == vVar9) {
          local_1a0 = uStack_198;
          uStack_19f = uStack_197;
          goto LAB_0010d015;
        }
        plVar3 = *(long **)(*(long *)(local_168 + 0x18) + -8 + lVar18);
        plVar4 = *(long **)(*(long *)(local_168 + 0x18) + lVar18);
        lVar18 = lVar18 + 0x20;
        vVar9 = vVar9 + 1;
      } while (plVar4 == plVar3);
      local_1a0 = (undefined1)vVar9;
      uStack_19f = (undefined7)(vVar9 >> 8);
      local_188 = plVar3;
      local_180 = vVar9;
      local_178 = plVar4;
      local_170 = vVar9;
    }
  } while( true );
  while( true ) {
    local_160.first.vCurr.m_value = local_160.first.vCurr.m_value + 1;
    ptVar12 = ptVar12 + 4;
    vVar9 = local_160.first.vEnd.m_value;
    if (local_160.first.vEnd.m_value == local_160.first.vCurr.m_value) break;
    if (*ptVar12 != (type)((_Vector_impl_data *)(ptVar12 + -1))->_M_start) {
      local_160.first.edges.super_type.m_initialized = true;
      local_160.first.edges.super_type.m_storage.dummy_.aligner_ =
           (type)((_Vector_impl_data *)(ptVar12 + -1))->_M_start;
      local_160.first.edges.super_type.m_storage.dummy_._8_8_ = local_160.first.vCurr.m_value;
      local_160.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar12;
      local_160.first.edges.super_type.m_storage.dummy_._24_8_ = local_160.first.vCurr.m_value;
      goto LAB_0010d219;
    }
  }
LAB_0010d1af:
  local_160.first.edges.super_type.m_initialized = false;
  local_160.first.vCurr.m_value = vVar9;
LAB_0010d219:
  local_160.first.vBegin.m_value = 0;
  local_160.second.vBegin.m_value = 0;
  local_160.second.edges.super_type.m_initialized = false;
  local_160.first.m_g = __return_storage_ptr__;
  local_160.second.vCurr.m_value = local_160.first.vEnd.m_value;
  local_160.second.vEnd.m_value = local_160.first.vEnd.m_value;
  local_160.second.m_g = __return_storage_ptr__;
  local_88 = &local_1a8;
  local_80 = &local_78;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_88,&local_160);
  max = local_bc;
  iVar7 = local_c0;
  this = &(__return_storage_ptr__->super_type).m_vertices;
LAB_0010d266:
  do {
    if (CONCAT71(uStack_19f,local_1a0) == CONCAT71(uStack_6f,local_70)) {
      if (CONCAT71(uStack_19f,local_1a0) == CONCAT71(uStack_197,uStack_198)) {
LAB_0010d35e:
        uVar6 = uVar6 >> 1;
        uVar15 = n / 2;
        uVar17 = (ulong)(int)(uVar6 + uVar15);
        uVar11 = (ulong)(int)(uVar6 + uVar15 + -1);
        uVar13 = uVar11;
        if (uVar11 < uVar17) {
          uVar13 = uVar17;
        }
        psVar14 = (__return_storage_ptr__->super_type).m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(__return_storage_ptr__->super_type).m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 5) <= uVar13
           ) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(this,uVar13 + 1);
          psVar14 = (this->
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        local_160.first.vBegin.m_value = uVar11;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                    *)(psVar14 + uVar17),
                   (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        psVar14 = (this->
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar11;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        *(undefined4 *)local_160.first.vCurr.m_value = 0;
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const>>
                           (*(undefined8 *)
                             &psVar14[uVar17].super_StoredVertex.m_out_edges.
                              super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                            ,*(pointer *)
                              ((long)&psVar14[uVar17].super_StoredVertex.m_out_edges.
                                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                              + 8));
        if ((undefined4 *)local_160.first.vCurr.m_value != (undefined4 *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        (((_Var10._M_current)->m_property)._M_t.
         super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>._M_t.
         super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>.
         super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl)->weight = -10000;
        uVar17 = (ulong)(int)(uVar6 + ~uVar15);
        uVar13 = uVar17;
        if (uVar17 < uVar11) {
          uVar13 = uVar11;
        }
        psVar14 = (__return_storage_ptr__->super_type).m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(__return_storage_ptr__->super_type).m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 5) <= uVar13
           ) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(this,uVar13 + 1);
          psVar14 = (this->
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        local_160.first.vBegin.m_value = uVar17;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                    *)(psVar14 + uVar11),
                   (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        psVar14 = (this->
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar17;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        *(undefined4 *)local_160.first.vCurr.m_value = 0;
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const>>
                           (*(undefined8 *)
                             &psVar14[uVar11].super_StoredVertex.m_out_edges.
                              super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                            ,*(pointer *)
                              ((long)&psVar14[uVar11].super_StoredVertex.m_out_edges.
                                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                              + 8));
        if ((undefined4 *)local_160.first.vCurr.m_value != (undefined4 *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        (((_Var10._M_current)->m_property)._M_t.
         super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>._M_t.
         super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>.
         super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl)->weight = -10000;
        if (local_b8._M_current != (pair<unsigned_long,_unsigned_long> *)0x0) {
          operator_delete(local_b8._M_current,local_a8 - (long)local_b8._M_current);
        }
        operator_delete(local_1e0.m_property.px,1);
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::~vector(&local_1e0.super_type.m_vertices);
        while ((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                *)local_1e0.super_type.m_edges.
                  super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next != &local_1e0) {
          paVar5 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                    *)(((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_1e0.super_type.m_edges.
                           super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                      super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
          operator_delete(local_1e0.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,0x28);
          local_1e0.super_type.m_edges.
          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)paVar5;
        }
        return __return_storage_ptr__;
      }
      if ((bStack_190 == 0) || (uStack_67._7_1_ == '\0')) {
LAB_0010d5aa:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_188 == local_58) goto LAB_0010d35e;
    }
    iVar8 = randomRange(iVar7,max);
    if (bStack_190 == 0) goto LAB_0010d5aa;
    *(int *)local_188[1] = iVar8;
    local_188 = local_188 + 2;
    if (local_188 == local_178) {
      vVar9 = CONCAT71(uStack_19f,local_1a0);
      lVar18 = vVar9 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_197,uStack_198) - 1U == vVar9) {
          local_1a0 = uStack_198;
          uStack_19f = uStack_197;
          goto LAB_0010d266;
        }
        plVar3 = *(long **)(*(long *)(local_168 + 0x18) + -8 + lVar18);
        plVar4 = *(long **)(*(long *)(local_168 + 0x18) + lVar18);
        lVar18 = lVar18 + 0x20;
        vVar9 = vVar9 + 1;
      } while (plVar4 == plVar3);
      local_1a0 = (undefined1)vVar9;
      uStack_19f = (undefined7)(vVar9 >> 8);
      local_188 = plVar3;
      local_180 = vVar9;
      local_178 = plVar4;
      local_170 = vVar9;
    }
  } while( true );
}

Assistant:

Graph createGridGraph(int n, int cost_min, int cost_max)
{
    Graph G;
    EdgeIterator ei, ei_end;

    for (int i = 0; i < n*n-1; ++i) {
        if( i%n == n-1) continue;
            
        if (i >= n*(n/2) && i%n < n/2 )
        {
            if (i == n*n/2 + n/2 -1 || i == n*n/2 + n/2) {
                continue;
            } else if(randomRange(0,1)){
                add_edge(i, i+1, G);
            } else {
                add_edge(i+1, i, G);    
            }
            continue;
        }
        add_edge(i, i+1, G);
    }

    for (int i = 0; i < n*n-n; ++i) {
        if (i >= n*(n/2-1) && i%n < n/2 ) {
            if (i == n*n/2 - n/2 - 1) {
                continue;
            } else if(randomRange(0,1)) {
                add_edge(i, i+n, G);
            } else {
                add_edge(i+n, i, G);    
            }
            continue;
        }
        add_edge(i, i+n, G);
    }

    // Converting to EdgeList graph
    std::vector<std::pair<Graph::vertex_descriptor, Graph::vertex_descriptor> > pairlist;
    for (boost::tie(ei, ei_end) = boost::edges(G); ei!=ei_end; ++ei) {
        pairlist.emplace_back(source(*ei, G), target(*ei, G));
    }
    Graph g(pairlist.begin(), pairlist.end(), num_vertices(G));

    // Adding weights
    for(boost::tie(ei, ei_end) = boost::edges(g); ei != ei_end; ++ei) {
        g[*ei].weight = randomRange(cost_min, cost_max);
    }

    add_edge(n*n/2 + n/2, n*n/2 + n/2 - 1, g);
    g[edge(n*n/2 + n/2, n*n/2 + n/2 - 1, g).first].weight = -10000;
    add_edge(n*n/2 + n/2 - 1, n*n/2 - n/2 - 1, g);
    g[edge(n*n/2 + n/2 - 1, n*n/2 - n/2 - 1, g).first].weight = -10000;

    return g;
}